

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::PrettyUnitTestResultPrinter::PrintFailedTestSuites(UnitTest *unit_test)

{
  bool bVar1;
  int iVar2;
  TestSuite *this;
  TestResult *this_00;
  char *pcVar3;
  TestSuite *test_suite;
  int i;
  int suite_failure_count;
  UnitTest *unit_test_local;
  
  test_suite._4_4_ = 0;
  for (test_suite._0_4_ = 0; iVar2 = UnitTest::total_test_suite_count(unit_test),
      (int)test_suite < iVar2; test_suite._0_4_ = (int)test_suite + 1) {
    this = UnitTest::GetTestSuite(unit_test,(int)test_suite);
    bVar1 = TestSuite::should_run(this);
    if (bVar1) {
      this_00 = TestSuite::ad_hoc_test_result(this);
      bVar1 = TestResult::Failed(this_00);
      if (bVar1) {
        ColoredPrintf(kRed,"[  FAILED  ] ");
        pcVar3 = TestSuite::name(this);
        printf("%s: SetUpTestSuite or TearDownTestSuite\n",pcVar3);
        test_suite._4_4_ = test_suite._4_4_ + 1;
      }
    }
  }
  if (0 < (int)test_suite._4_4_) {
    pcVar3 = "SUITES";
    if (test_suite._4_4_ == 1) {
      pcVar3 = "SUITE";
    }
    printf("\n%2d FAILED TEST %s\n",(ulong)test_suite._4_4_,pcVar3);
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::PrintFailedTestSuites(
    const UnitTest& unit_test) {
  int suite_failure_count = 0;
  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    const TestSuite& test_suite = *unit_test.GetTestSuite(i);
    if (!test_suite.should_run()) {
      continue;
    }
    if (test_suite.ad_hoc_test_result().Failed()) {
      ColoredPrintf(GTestColor::kRed, "[  FAILED  ] ");
      printf("%s: SetUpTestSuite or TearDownTestSuite\n", test_suite.name());
      ++suite_failure_count;
    }
  }
  if (suite_failure_count > 0) {
    printf("\n%2d FAILED TEST %s\n", suite_failure_count,
           suite_failure_count == 1 ? "SUITE" : "SUITES");
  }
}